

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_METAL_TEXM3X3SPEC_helper(Context *ctx)

{
  uint uVar1;
  
  if (ctx->glsl_generated_texm3x3spec_helper == 0) {
    ctx->glsl_generated_texm3x3spec_helper = 1;
    push_output(ctx,&ctx->helpers);
    output_line(ctx,"float3 TEXM3X3SPEC_reflection(const float3 normal, const float3 eyeray)");
    output_line(ctx,"{");
    ctx->indent = ctx->indent + 1;
    output_line(ctx,"return (2.0 * ((normal * eyeray) / (normal * normal)) * normal) - eyeray;");
    ctx->indent = ctx->indent + -1;
    output_line(ctx,"}");
    if (ctx->output == (Buffer *)0x0) {
      __assert_fail("ctx->output != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x1d3,"void output_blank_line(Context *)");
    }
    if (ctx->isfail == 0) {
      buffer_append(ctx->output,ctx->endline,(long)ctx->endline_len);
    }
    if (ctx->output_stack_len < 1) {
      __assert_fail("ctx->output_stack_len > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x173,"void pop_output(Context *)");
    }
    uVar1 = ctx->output_stack_len - 1;
    ctx->output_stack_len = uVar1;
    ctx->output = ctx->output_stack[uVar1];
    ctx->indent = ctx->indent_stack[uVar1];
  }
  return;
}

Assistant:

static void emit_METAL_TEXM3X3SPEC_helper(Context *ctx)
{
    if (ctx->glsl_generated_texm3x3spec_helper)
        return;

    ctx->glsl_generated_texm3x3spec_helper = 1;

    push_output(ctx, &ctx->helpers);
    output_line(ctx, "float3 TEXM3X3SPEC_reflection(const float3 normal, const float3 eyeray)");
    output_line(ctx, "{"); ctx->indent++;
    output_line(ctx,   "return (2.0 * ((normal * eyeray) / (normal * normal)) * normal) - eyeray;"); ctx->indent--;
    output_line(ctx, "}");
    output_blank_line(ctx);
    pop_output(ctx);
}